

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_connection.hpp
# Opt level: O2

int __thiscall
cpp_client::Connection_internal::connect
          (Connection_internal *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  addrinfo *__ai;
  int iVar1;
  int iVar2;
  Communication_error *pCVar3;
  addrinfo *paVar4;
  undefined4 in_register_00000034;
  addrinfo *result;
  string port_str;
  addrinfo local_68;
  
  local_68.ai_flags = 0;
  local_68.ai_family = 0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 0;
  std::__cxx11::to_string(&port_str,(uint)__addr);
  iVar2 = 0;
LAB_0012600f:
  if (iVar2 == 3) {
    if (this->sock_ != -1) {
      iVar2 = std::__cxx11::string::~string((string *)&port_str);
      return iVar2;
    }
    pCVar3 = (Communication_error *)__cxa_allocate_exception(0x10);
    Communication_error::runtime_error(pCVar3,"Could not connect to server.");
    __cxa_throw(pCVar3,&Communication_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = getaddrinfo((char *)CONCAT44(in_register_00000034,__fd),port_str._M_dataplus._M_p,
                      &local_68,(addrinfo **)&result);
  __ai = result;
  switch(iVar1) {
  case 0:
    for (paVar4 = result; paVar4 != (addrinfo *)0x0; paVar4 = paVar4->ai_next) {
      iVar1 = socket(paVar4->ai_family,paVar4->ai_socktype,paVar4->ai_protocol);
      this->sock_ = iVar1;
      if ((iVar1 != -1) &&
         (iVar1 = ::connect(iVar1,(sockaddr *)paVar4->ai_addr,paVar4->ai_addrlen), iVar1 == -1)) {
        close(this->sock_);
        this->sock_ = -1;
      }
    }
    goto switchD_00126040_caseD_fffffffd;
  case -10:
    pCVar3 = (Communication_error *)__cxa_allocate_exception(0x10);
    Communication_error::runtime_error(pCVar3,"Could not resolve host name - Out of memory.");
    break;
  default:
    pCVar3 = (Communication_error *)__cxa_allocate_exception(0x10);
    Communication_error::runtime_error(pCVar3,"Could not resolve host name - Unknown error.");
    break;
  case -4:
    pCVar3 = (Communication_error *)__cxa_allocate_exception(0x10);
    Communication_error::runtime_error(pCVar3,"Could not resolve host name - Unrecoverable error.");
    break;
  case -3:
    goto switchD_00126040_caseD_fffffffd;
  case -2:
    pCVar3 = (Communication_error *)__cxa_allocate_exception(0x10);
    Communication_error::runtime_error(pCVar3,"Could not resolve host name - Host not found.");
  }
  __cxa_throw(pCVar3,&Communication_error::typeinfo,std::runtime_error::~runtime_error);
switchD_00126040_caseD_fffffffd:
  freeaddrinfo((addrinfo *)__ai);
  iVar2 = iVar2 + 1;
  goto LAB_0012600f;
}

Assistant:

void connect(const char* host, unsigned port)
   {
      struct Free_addr
      {
         addrinfo* info;
         ~Free_addr()
         {
            freeaddrinfo(info);
         }
      };
      // can have temporary name resolution failure so specify a number of tries
      constexpr auto num_tries = 3;
      // set up structures needed
      addrinfo* result;
      addrinfo hints;
      memset(&hints, 0, sizeof(hints));
      hints.ai_family = AF_UNSPEC;
      hints.ai_socktype = SOCK_STREAM;
      hints.ai_protocol = IPPROTO_IP;
      const auto port_str = std::to_string(port);
      // now try to connect
      for(auto i = 0; i < num_tries; ++i)
      {
         const auto resaddr = getaddrinfo(host, port_str.c_str(), &hints, &result);
         // free the memory allocated if going out of scope
         Free_addr dummy{result};
         if(resaddr != 0)
         {
            using ce = Communication_error;
            switch(resaddr)
            {
            case EAI_AGAIN:  continue;
            case EAI_FAIL:   throw ce("Could not resolve host name - Unrecoverable error.");
            case EAI_MEMORY: throw ce("Could not resolve host name - Out of memory.");
            case EAI_NONAME: throw ce("Could not resolve host name - Host not found.");
            default:         throw ce("Could not resolve host name - Unknown error.");
            }
         }
         // now create the socket by trying to connect to all possible addresses
         for(auto ptr = result; ptr; ptr = ptr->ai_next)
         {
            sock_ = socket(ptr->ai_family, ptr->ai_socktype, ptr->ai_protocol);
            if(sock_ == -1)
            {
               continue;
            }
            const auto res = ::connect(sock_, ptr->ai_addr, static_cast<int>(ptr->ai_addrlen));
            if(res == -1)
            {
               close(sock_);
               sock_ = -1;
            }
         }
      }
      // if sock_ is invalid some sort of error occured
      if(sock_ == -1)
      {
         throw Communication_error("Could not connect to server.");
      }
   }